

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

void __thiscall
ONX_Model::Internal_RemoveModelComponentReferenceLink
          (ONX_Model *this,ONX_ModelComponentReferenceLink *mcr_link)

{
  Type component_type;
  uint uVar1;
  ON_ModelComponent *this_00;
  ONX_ModelComponentList *pOVar2;
  ONX_ModelComponentList *list;
  ON_ModelComponent *model_component;
  ONX_ModelComponentReferenceLink *mcr_link_local;
  ONX_Model *this_local;
  
  if ((mcr_link != (ONX_ModelComponentReferenceLink *)0x0) &&
     (this_00 = ON_ModelComponentReference::ModelComponent(&mcr_link->m_mcr),
     this_00 != (ON_ModelComponent *)0x0)) {
    uVar1 = ON_ModelComponent::ReferenceModelSerialNumber(this_00);
    ON_SerialNumberMap::RemoveSerialNumberAndId(&this->m_mcr_sn_map,(ulong)uVar1);
    ON_ModelComponentReference::operator=(&mcr_link->m_mcr,&ON_ModelComponentReference::Empty);
    component_type = ON_ModelComponent::ComponentType(this_00);
    pOVar2 = Internal_ComponentList(this,component_type);
    if (pOVar2->m_count != 0) {
      if (mcr_link->m_prev == (ONX_ModelComponentReferenceLink *)0x0) {
        pOVar2->m_first_mcr_link = mcr_link->m_next;
      }
      else {
        mcr_link->m_prev->m_next = mcr_link->m_next;
      }
      if (mcr_link->m_next == (ONX_ModelComponentReferenceLink *)0x0) {
        pOVar2->m_last_mcr_link = mcr_link->m_prev;
      }
      else {
        mcr_link->m_next->m_prev = mcr_link->m_prev;
      }
      pOVar2->m_count = pOVar2->m_count - 1;
    }
    mcr_link->m_prev = (ONX_ModelComponentReferenceLink *)0x0;
    mcr_link->m_next = (ONX_ModelComponentReferenceLink *)0x0;
    ON_FixedSizePool::ReturnElement(&this->m_mcr_link_fsp,mcr_link);
  }
  return;
}

Assistant:

void ONX_Model::Internal_RemoveModelComponentReferenceLink(
class ONX_ModelComponentReferenceLink* mcr_link
  )
{
  if (nullptr == mcr_link)
    return;

  const ON_ModelComponent* model_component = mcr_link->m_mcr.ModelComponent();

  if ( nullptr == model_component )
    return;

  m_mcr_sn_map.RemoveSerialNumberAndId(model_component->ReferenceModelSerialNumber());

  mcr_link->m_mcr = ON_ModelComponentReference::Empty;

  ONX_Model::ONX_ModelComponentList& list = Internal_ComponentList(model_component->ComponentType());
  if (list.m_count > 0)
  {
    if (mcr_link->m_prev)
      mcr_link->m_prev->m_next = mcr_link->m_next;
    else
      list.m_first_mcr_link = mcr_link->m_next;
    if (mcr_link->m_next)
      mcr_link->m_next->m_prev = mcr_link->m_prev;
    else
      list.m_last_mcr_link = mcr_link->m_prev;
    list.m_count--;
  }

  mcr_link->m_prev = nullptr;
  mcr_link->m_next = nullptr;

  m_mcr_link_fsp.ReturnElement(mcr_link);
}